

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O2

void check_source_state_int(SourceWrapper *src,ALenum param,ALint *current)

{
  uint in_EAX;
  ulong uStack_28;
  ALint ival;
  
  uStack_28 = (ulong)in_EAX;
  (*REAL_alGetSourcei)(src->name,param,&ival);
  if (ival != *current) {
    writele32(0xc);
    writele32(src->name);
    writele32(param);
    writele32(ival);
    *current = ival;
  }
  return;
}

Assistant:

static void check_source_state_int(SourceWrapper *src, const ALenum param, ALint *current)
{
    ALint ival = 0;
    REAL_alGetSourcei(src->name, param, &ival);
    if (ival != *current) {
        IO_EVENTENUM(ALEE_SOURCE_STATE_CHANGED_INT);
        IO_UINT32(src->name);
        IO_ENUM(param);
        IO_INT32(ival);
        *current = ival;
    }
}